

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  string *psVar1;
  string local_90;
  undefined1 local_60 [8];
  string base;
  string local_38 [4];
  int lastslash;
  string proto_file;
  FileDescriptor *descriptor_local;
  
  proto_file.field_2._8_8_ = this;
  psVar1 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  std::__cxx11::string::string(local_38,(string *)psVar1);
  base.field_2._12_4_ = std::__cxx11::string::find_last_of((char *)local_38,0x5db301);
  std::__cxx11::string::substr((ulong)local_60,(ulong)local_38);
  StripDotProto(&local_90,(string *)local_60);
  UnderscoresToPascalCase(__return_storage_ptr__,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
    std::string proto_file = descriptor->name();
    int lastslash = proto_file.find_last_of("/");
    std::string base = proto_file.substr(lastslash + 1);
    return UnderscoresToPascalCase(StripDotProto(base));
}